

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O2

int check_padding_md(EVP_MD *md,int padding)

{
  if (padding == 3 && md != (EVP_MD *)0x0) {
    ERR_put_error(6,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x151);
  }
  return (uint)(padding != 3 || md == (EVP_MD *)0x0);
}

Assistant:

static int check_padding_md(const EVP_MD *md, int padding) {
  if (!md) {
    return 1;
  }

  if (padding == RSA_NO_PADDING) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
    return 0;
  }

  return 1;
}